

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckAllTypes(UpgradeMemoryModel *this,Instruction *inst)

{
  pair<bool,_bool> pVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  DefUseManager *pDVar5;
  byte bVar6;
  uint32_t uVar7;
  bool bVar8;
  __ireturn_type _Var9;
  Instruction *def;
  undefined4 local_94;
  Instruction *local_90;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  stack;
  Instruction *inst_local;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  visited;
  
  visited._M_h._M_buckets = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  stack.
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inst_local = inst;
  std::
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>::
  push_back(&stack,&inst_local);
  bVar8 = false;
  local_94 = 0;
LAB_001a02e8:
  do {
    do {
      if (stack.
          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          stack.
          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar6 = (undefined1)local_94;
LAB_001a0422:
        pVar1.second = (bool)bVar6;
        pVar1.first = bVar8;
        std::
        _Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
        ::~_Vector_base(&stack.
                         super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                       );
        std::
        _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&visited._M_h);
        return pVar1;
      }
      def = stack.
            super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1];
      stack.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           stack.
           super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      _Var9 = std::__detail::
              _Insert_base<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&visited,&def);
    } while (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    if (def->opcode_ != OpTypeStruct) {
      iVar4 = spvOpcodeIsComposite(def->opcode_);
      if (iVar4 == 0) {
        if (def->opcode_ != OpTypePointer) goto LAB_001a02e8;
        pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
        uVar7 = 1;
      }
      else {
        pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
        uVar7 = 0;
      }
      uVar7 = Instruction::GetSingleWordInOperand(def,uVar7);
      local_90 = analysis::DefUseManager::GetDef(pDVar5,uVar7);
      std::
      vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>::
      emplace_back<spvtools::opt::Instruction_const*>
                ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                  *)&stack,&local_90);
      goto LAB_001a02e8;
    }
    bVar2 = HasDecoration(this,def,0xffffffff,Coherent);
    bVar8 = (bool)(bVar8 | bVar2);
    bVar2 = HasDecoration(this,def,0xffffffff,Volatile);
    bVar6 = (byte)local_94 | bVar2;
    if ((bVar6 != 0 & bVar8) != 0) goto LAB_001a0422;
    local_94 = CONCAT31((int3)((uint)local_94 >> 8),bVar6);
    for (uVar7 = 0; uVar3 = Instruction::NumInOperands(def), uVar7 < uVar3; uVar7 = uVar7 + 1) {
      pDVar5 = IRContext::get_def_use_mgr((this->super_Pass).context_);
      uVar3 = Instruction::GetSingleWordInOperand(def,uVar7);
      local_90 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
      std::
      vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>::
      emplace_back<spvtools::opt::Instruction_const*>
                ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                  *)&stack,&local_90);
    }
  } while( true );
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckAllTypes(
    const Instruction* inst) {
  std::unordered_set<const Instruction*> visited;
  std::vector<const Instruction*> stack;
  stack.push_back(inst);

  bool is_coherent = false;
  bool is_volatile = false;
  while (!stack.empty()) {
    const Instruction* def = stack.back();
    stack.pop_back();

    if (!visited.insert(def).second) continue;

    if (def->opcode() == spv::Op::OpTypeStruct) {
      // Any member decorated with coherent and/or volatile is enough to have
      // the related operation be flagged as coherent and/or volatile.
      is_coherent |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Volatile);
      if (is_coherent && is_volatile)
        return std::make_pair(is_coherent, is_volatile);

      // Check the subtypes.
      for (uint32_t i = 0; i < def->NumInOperands(); ++i) {
        stack.push_back(context()->get_def_use_mgr()->GetDef(
            def->GetSingleWordInOperand(i)));
      }
    } else if (spvOpcodeIsComposite(def->opcode())) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(0u)));
    } else if (def->opcode() == spv::Op::OpTypePointer) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(1u)));
    }
  }

  return std::make_pair(is_coherent, is_volatile);
}